

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::AtSecondSingletonClassAtom
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  undefined4 *puVar4;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  EVar3 = ECLookahead(this,0);
  if (EVar3 != L'-') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x773,"(ECLookahead() == \'-\')","ECLookahead() == \'-\'");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  EVar3 = ECLookahead(this,1);
  if ((EVar3 == L'\\') &&
     ((((EVar3 = ECLookahead(this,2), EVar3 == L'D' || (EVar3 == L'S')) || (EVar3 == L'W')) ||
      (((EVar3 == L'd' || (EVar3 == L's')) || (EVar3 == L'w')))))) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::AtSecondSingletonClassAtom()
    {
        Assert(ECLookahead() == '-');
        if (ECLookahead(1) == '\\')
        {
            switch (ECLookahead(2))
            {
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                // These all denote non-singleton sets
                return false;
            default:
                // fall-through for singleton
                break;
            }
        }
        return true;
    }